

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O1

int ll_seeall(lua_State *L)

{
  int iVar1;
  
  luaL_checktype(L,1,5);
  iVar1 = lua_getmetatable(L,1);
  if (iVar1 == 0) {
    lua_createtable(L,0,1);
    lua_pushvalue(L,-1);
    lua_setmetatable(L,1);
  }
  lua_pushvalue(L,-0x2712);
  lua_setfield(L,-2,"__index");
  return 0;
}

Assistant:

static int ll_seeall (lua_State *L) {
  luaL_checktype(L, 1, LUA_TTABLE);
  if (!lua_getmetatable(L, 1)) {
    lua_createtable(L, 0, 1); /* create new metatable */
    lua_pushvalue(L, -1);
    lua_setmetatable(L, 1);
  }
  lua_pushvalue(L, LUA_GLOBALSINDEX);
  lua_setfield(L, -2, "__index");  /* mt.__index = _G */
  return 0;
}